

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

SUNErrCode N_VBufSize(N_Vector x,sunindextype *size)

{
  SUNErrCode SVar1;
  
  SVar1 = (*x->ops->nvbufsize)(x,size);
  return SVar1;
}

Assistant:

SUNErrCode N_VBufSize(N_Vector x, sunindextype* size)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  SUNAssert(x->ops->nvbufsize, SUN_ERR_NOT_IMPLEMENTED);
  ier = x->ops->nvbufsize(x, size);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}